

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_pool_2d(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ggml_tensor *pgVar8;
  long lVar9;
  long lVar10;
  void *pvVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  undefined8 uVar16;
  float *pfVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  float *pfVar21;
  undefined4 uVar22;
  float fVar23;
  int local_9c;
  int local_98;
  void *local_88;
  void *local_78;
  long local_70;
  
  if (params->ith == 0) {
    pgVar8 = dst->src[0];
    iVar1 = dst->op_params[0];
    uVar2 = dst->op_params[1];
    uVar3 = dst->op_params[2];
    iVar4 = dst->op_params[3];
    iVar5 = dst->op_params[4];
    iVar6 = dst->op_params[5];
    iVar7 = dst->op_params[6];
    local_88 = pgVar8->data;
    lVar10 = ggml_nbytes(pgVar8);
    if (0 < lVar10) {
      pvVar11 = (void *)(lVar10 + (long)local_88);
      lVar10 = dst->ne[0];
      lVar9 = dst->ne[1];
      local_78 = dst->data;
      do {
        if (0 < lVar9) {
          local_70 = 0;
          local_9c = -iVar7;
          do {
            if (0 < lVar10) {
              if (iVar1 == 2) {
                uVar16 = 0x18cf;
LAB_00142b3a:
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                           ,uVar16,"fatal error");
              }
              lVar12 = local_70 * lVar10;
              lVar15 = 0;
              local_98 = -iVar6;
              do {
                if (iVar1 == 1) {
                  uVar22 = 0;
LAB_001429c3:
                  *(undefined4 *)((long)local_78 + lVar15 * 4 + lVar12 * 4) = uVar22;
                }
                else {
                  uVar22 = 0xff7fffff;
                  if (iVar1 == 0) goto LAB_001429c3;
                }
                if (0 < (int)uVar3) {
                  lVar18 = (long)local_98;
                  uVar14 = 0;
                  lVar20 = (long)local_9c;
                  do {
                    lVar13 = uVar14 + (long)(iVar5 * (int)local_70 - iVar7);
                    if (((-1 < lVar13) && (lVar13 < pgVar8->ne[1])) && (0 < (int)uVar2)) {
                      lVar13 = pgVar8->nb[1] * lVar20;
                      pfVar21 = (float *)((long)local_88 + lVar13 + lVar18 * 4);
                      uVar19 = 0;
                      do {
                        if ((-1 < (long)(lVar18 + uVar19)) &&
                           ((long)(lVar18 + uVar19) < pgVar8->ne[0])) {
                          pfVar17 = pfVar21;
                          if (pgVar8->type != GGML_TYPE_F32) {
                            pfVar17 = (float *)(&ggml_table_f32_f16 +
                                               (ulong)*(ushort *)
                                                       ((long)local_88 +
                                                       uVar19 * 2 + lVar13 + lVar18 * 2) * 4);
                          }
                          fVar23 = *pfVar17;
                          if (iVar1 == 0) {
                            if (*(float *)((long)local_78 + lVar15 * 4 + lVar12 * 4) < fVar23)
                            goto LAB_00142a71;
                          }
                          else if (iVar1 == 1) {
                            fVar23 = fVar23 + *(float *)((long)local_78 + lVar15 * 4 + lVar12 * 4);
LAB_00142a71:
                            *(float *)((long)local_78 + lVar15 * 4 + lVar12 * 4) = fVar23;
                          }
                          else if (iVar1 == 2) {
                            uVar16 = 0x18df;
                            goto LAB_00142b3a;
                          }
                        }
                        uVar19 = uVar19 + 1;
                        pfVar21 = pfVar21 + 1;
                      } while (uVar2 != uVar19);
                    }
                    uVar14 = uVar14 + 1;
                    lVar20 = lVar20 + 1;
                  } while (uVar14 != uVar3);
                }
                if (iVar1 == 1) {
                  *(float *)((long)local_78 + lVar15 * 4 + lVar12 * 4) =
                       *(float *)((long)local_78 + lVar15 * 4 + lVar12 * 4) /
                       (float)(int)(uVar2 * uVar3);
                }
                else if (iVar1 == 2) {
                  uVar16 = 0x18e6;
                  goto LAB_00142b3a;
                }
                lVar15 = lVar15 + 1;
                local_98 = local_98 + iVar4;
              } while (lVar15 != lVar10);
            }
            local_70 = local_70 + 1;
            local_9c = local_9c + iVar5;
          } while (local_70 != lVar9);
        }
        local_88 = (void *)((long)local_88 + pgVar8->nb[2]);
        local_78 = (void *)((long)local_78 + lVar9 * lVar10 * 4);
      } while (local_88 < pvVar11);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_pool_2d(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src = dst->src[0];

    assert(src->type == GGML_TYPE_F32 || src->type == GGML_TYPE_F16);

    if (params->ith != 0) {
        return;
    }

    const int32_t * opts = (const int32_t *)dst->op_params;
    ggml_op_pool op = static_cast<ggml_op_pool>(opts[0]);
    const int k0 = opts[1];
    const int k1 = opts[2];
    const int s0 = opts[3];
    const int s1 = opts[4];
    const int p0 = opts[5];
    const int p1 = opts[6];
    const char * cdata = (const char*)src->data;
    const char * const data_end = cdata + ggml_nbytes(src);

    const int64_t px = dst->ne[0];
    const int64_t py = dst->ne[1];
    const int64_t pa = px * py;

    float * dplane = (float *)dst->data;

    const int ka = k0 * k1;
    const int offset0 = -p0;
    const int offset1 = -p1;

    while (cdata < data_end) {
        for (int oy = 0; oy < py; ++oy) {
            float * const drow = dplane + oy * px;
            for (int ox = 0; ox < px; ++ox) {
                float * const out =  drow + ox;
                switch (op) {
                    case GGML_OP_POOL_AVG:     *out = 0;        break;
                    case GGML_OP_POOL_MAX:     *out = -FLT_MAX; break;
                    case GGML_OP_POOL_COUNT: GGML_ABORT("fatal error");
                }

                const int ix = offset0 + ox * s0;
                const int iy = offset1 + oy * s1;

                for (int ky = 0; ky < k1; ++ky) {
                    if (iy + ky < 0 || iy + ky >= src->ne[1]) continue;
                    const void * srow = (const void *)(cdata + src->nb[1] * (iy + ky));
                    for (int kx = 0; kx < k0; ++kx) {
                        int j = ix + kx;
                        if (j < 0 || j >= src->ne[0]) continue;
                        const float srow_j = (src->type == GGML_TYPE_F32) ? ((const float*)srow)[j] : GGML_FP16_TO_FP32(((const ggml_fp16_t*)srow)[j]);
                        switch (op) {
                            case GGML_OP_POOL_AVG:                     *out += srow_j; break;
                            case GGML_OP_POOL_MAX: if (srow_j > *out)  *out  = srow_j; break;
                            case GGML_OP_POOL_COUNT:               GGML_ABORT("fatal error");
                        }
                    }
                }
                switch (op) {
                    case GGML_OP_POOL_AVG:           *out /= ka; break;
                    case GGML_OP_POOL_MAX:                       break;
                    case GGML_OP_POOL_COUNT: GGML_ABORT("fatal error");
                }
            }
        }

        cdata  += src->nb[2];
        dplane += pa;
    }
}